

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

char * tok_casefold_defsym(tokcxdef *ctx,char *outbuf,char *src,int len)

{
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  
  pcVar3 = src;
  if ((((ulong)ctx & 2) != 0) && (pcVar3 = outbuf, 0 < len)) {
    iVar4 = 0x27;
    if ((uint)len < 0x27) {
      iVar4 = len;
    }
    ppuVar1 = __ctype_b_loc();
    iVar4 = iVar4 + 1;
    lVar5 = 0;
    do {
      bVar6 = src[lVar5];
      if ((*(byte *)((long)*ppuVar1 + (ulong)bVar6 * 2 + 1) & 1) != 0) {
        pp_Var2 = __ctype_tolower_loc();
        bVar6 = *(byte *)(*pp_Var2 + bVar6);
      }
      outbuf[lVar5] = bVar6;
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return pcVar3;
}

Assistant:

static char *tok_casefold_defsym(tokcxdef *ctx, char *outbuf,
                                 char *src, int len)
{
    if (ctx->tokcxflg & TOKCXCASEFOLD)
    {
        char *dst;
        int   rem;

        /* make a lower-case copy of the symbol */
        rem = (len > TOKNAMMAX ? TOKNAMMAX : len);
        for (dst = outbuf ; rem > 0 ; ++dst, ++src, --rem)
            *dst = (isupper((uchar)*src) ? tolower((uchar)*src) : *src);

        /* use the lower-case copy instead of the original */
        return outbuf;
    }
    else
    {
        /* return the original unchanged */
        return src;
    }
}